

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
OnCallSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::
Matches(OnCallSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
        *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
  *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>>,std::tuple<std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&>>
                    ((tuple<testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>_>
                      *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>_&>
               ::Matches((MatcherBase<const_std::tuple<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>_&>
                          *)(this + 0x28),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }